

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

SubControl __thiscall QComboBoxPrivate::newHoverControl(QComboBoxPrivate *this,QPoint *pos)

{
  QWidget *this_00;
  SubControl SVar1;
  QStyle *pQVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QStyleOptionComboBox opt;
  QStyleOptionComboBox QStack_b8;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  memset(&QStack_b8,0xaa,0x90);
  QStyleOptionComboBox::QStyleOptionComboBox(&QStack_b8);
  (**(code **)(*(long *)this_00 + 0x1b8))(this_00,&QStack_b8);
  QStack_b8.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)(QFlagsStorage<QStyle::SubControl>)0xffffffff;
  pQVar2 = QWidget::style(this_00);
  SVar1 = (**(code **)(*(long *)pQVar2 + 0xd0))(pQVar2,1,&QStack_b8,pos,this_00);
  this->hoverControl = SVar1;
  if (SVar1 == SC_None) {
    QVar3 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  else {
    pQVar2 = QWidget::style(this_00);
    QVar3 = (QRect)(**(code **)(*(long *)pQVar2 + 0xd8))
                             (pQVar2,1,&QStack_b8,this->hoverControl,this_00);
  }
  this->hoverRect = QVar3;
  SVar1 = this->hoverControl;
  QIcon::~QIcon(&QStack_b8.currentIcon);
  if (&(QStack_b8.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((QStack_b8.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(QStack_b8.currentText.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&QStack_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SVar1;
  }
  __stack_chk_fail();
}

Assistant:

QStyle::SubControl QComboBoxPrivate::newHoverControl(const QPoint &pos)
{
    Q_Q(QComboBox);
    QStyleOptionComboBox opt;
    q->initStyleOption(&opt);
    opt.subControls = QStyle::SC_All;
    hoverControl = q->style()->hitTestComplexControl(QStyle::CC_ComboBox, &opt, pos, q);
    hoverRect = (hoverControl != QStyle::SC_None)
                   ? q->style()->subControlRect(QStyle::CC_ComboBox, &opt, hoverControl, q)
                   : QRect();
    return hoverControl;
}